

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_typed_array(basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                    *this,span<const_unsigned_char,_18446744073709551615UL> *v,semantic_tag tag,
                   ser_context *context,error_code *ec)

{
  bool bVar1;
  ser_context *context_00;
  ser_context *psVar2;
  char in_DL;
  span<const_unsigned_char,_18446744073709551615UL> *in_RSI;
  basic_json_visitor<char> *in_RDI;
  error_code *in_R8;
  basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
  *unaff_retaddr;
  const_iterator p;
  ser_context *in_stack_ffffffffffffffa8;
  type_conflict tVar3;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  ser_context *value;
  byte_string_view *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = cbor_encode_options::use_typed_arrays((cbor_encode_options *)(in_RDI + 2));
  if (bVar1) {
    if (in_DL == '\x11') {
      write_tag(unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      tVar3 = (type_conflict)((ulong)in_RDI >> 0x20);
    }
    else {
      write_tag(unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      tVar3 = (type_conflict)((ulong)in_RDI >> 0x20);
    }
    byte_string_view::
    byte_string_view<jsoncons::detail::span<unsigned_char_const,18446744073709551615ul>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,tVar3);
    write_byte_string((basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                       *)context,(byte_string_view *)ec);
  }
  else {
    jsoncons::detail::span<const_unsigned_char,_18446744073709551615UL>::size(in_RSI);
    basic_json_visitor<char>::begin_array
              ((basic_json_visitor<char> *)in_stack_ffffffffffffffc0,
               (size_t)in_stack_ffffffffffffffb8,(semantic_tag)((ulong)in_RDI >> 0x38),
               in_stack_ffffffffffffffa8,(error_code *)0x2973fe);
    bVar1 = std::error_code::operator_cast_to_bool(in_R8);
    if (!bVar1) {
      context_00 = (ser_context *)
                   jsoncons::detail::span<const_unsigned_char,_18446744073709551615UL>::begin
                             (in_RSI);
      while (value = context_00,
            psVar2 = (ser_context *)
                     jsoncons::detail::span<const_unsigned_char,_18446744073709551615UL>::end
                               (in_RSI), context_00 != psVar2) {
        basic_json_visitor<char>::uint64_value
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffffc0,(uint64_t)value,
                   (semantic_tag)((ulong)in_RDI >> 0x38),context_00,(error_code *)0x29746f);
        bVar1 = std::error_code::operator_cast_to_bool(in_R8);
        if (bVar1) {
          return true;
        }
        context_00 = (ser_context *)((long)&value->_vptr_ser_context + 1);
      }
      basic_json_visitor<char>::end_array(in_RDI,context_00,(error_code *)0x2974b0);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint8_t>& v, 
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        if (options_.use_typed_arrays())
        {
            switch (tag)
            {
                case semantic_tag::clamped:
                    write_tag(0x44);
                    break;
                default:
                    write_tag(0x40);
                    break;
            }
            write_byte_string(byte_string_view(v));
            JSONCONS_VISITOR_RETURN;
        }
        else
        {
            this->begin_array(v.size(), semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = v.begin(); p != v.end(); ++p)
            {
                this->uint64_value(*p, tag, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            this->end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }
    }